

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RefCntAutoPtr.hpp
# Opt level: O1

RefCntAutoPtr<Diligent::IDataBlob> * __thiscall
Diligent::RefCntAutoPtr<Diligent::IDataBlob>::operator=
          (RefCntAutoPtr<Diligent::IDataBlob> *this,RefCntAutoPtr<Diligent::DataBlobImpl> *AutoPtr)

{
  DataBlobImpl *pDVar1;
  DataBlobImpl *pDVar2;
  DataBlobImpl *pObj;
  
  pDVar1 = (DataBlobImpl *)this->m_pObject;
  pDVar2 = AutoPtr->m_pObject;
  if (pDVar1 != pDVar2) {
    AutoPtr->m_pObject = (DataBlobImpl *)0x0;
    if (pDVar1 != (DataBlobImpl *)0x0) {
      (*(pDVar1->super_ObjectBase<Diligent::IDataBlob>).super_RefCountedObject<Diligent::IDataBlob>.
        super_IDataBlob.super_IObject._vptr_IObject[2])();
      this->m_pObject = (IDataBlob *)0x0;
    }
    this->m_pObject = (IDataBlob *)pDVar2;
  }
  return this;
}

Assistant:

RefCntAutoPtr& operator=(RefCntAutoPtr<DerivedType>&& AutoPtr) noexcept
    {
        if (m_pObject != AutoPtr.m_pObject)
            Attach(AutoPtr.Detach());

        return *this;
    }